

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O3

bool __thiscall
QConfFileSettingsPrivate::readIniLine
          (QConfFileSettingsPrivate *this,QByteArrayView data,qsizetype *dataPos,
          qsizetype *lineStart,qsizetype *lineLen,qsizetype *equalsPos)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  QConfFileSettingsPrivate *pQVar5;
  QConfFileSettingsPrivate *pQVar6;
  QConfFileSettingsPrivate *pQVar7;
  long lVar8;
  long lVar9;
  
  lVar9 = data.m_size;
  *lineLen = -1;
  pQVar5 = *(QConfFileSettingsPrivate **)data.m_data;
  *dataPos = (qsizetype)pQVar5;
  if ((long)pQVar5 < (long)this) {
    do {
      if ((SettingsImpl::charTraits
           [*(byte *)((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData
                             ._vptr_QObjectData + lVar9)] & 1) == 0) goto LAB_0042c950;
      pQVar5 = (QConfFileSettingsPrivate *)
               ((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData.
                       _vptr_QObjectData + 1);
      *dataPos = (qsizetype)pQVar5;
      pQVar7 = this;
    } while (this != pQVar5);
  }
  else {
LAB_0042c950:
    pQVar7 = pQVar5;
    if ((long)pQVar5 < (long)this) {
      bVar4 = false;
      do {
        while (bVar1 = *(byte *)((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.
                                        super_QObjectData._vptr_QObjectData + lVar9),
              (SettingsImpl::charTraits[bVar1] & 2) != 0) {
          pQVar6 = (QConfFileSettingsPrivate *)
                   ((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData.
                           _vptr_QObjectData + 1);
          if (bVar1 < 0x22) {
            if ((bVar1 == 10) || (bVar1 == 0xd)) {
              pQVar7 = pQVar6;
              if ((QConfFileSettingsPrivate *)*dataPos != pQVar5) goto LAB_0042ca33;
            }
            else {
LAB_0042ca11:
              if ((QConfFileSettingsPrivate *)*dataPos != pQVar5) {
LAB_0042ca33:
                pQVar7 = pQVar5;
                if (bVar4) goto LAB_0042ca39;
                goto LAB_0042ca72;
              }
              if ((long)pQVar6 < (long)this) {
                do {
                  cVar3 = *(char *)((long)&(pQVar6->super_QSettingsPrivate).super_QObjectPrivate.
                                           super_QObjectData._vptr_QObjectData + lVar9);
                  if ((cVar3 == '\n') || (cVar3 == '\r')) goto LAB_0042ca47;
                  pQVar6 = (QConfFileSettingsPrivate *)
                           ((long)&(pQVar6->super_QSettingsPrivate).super_QObjectPrivate.
                                   super_QObjectData._vptr_QObjectData + 1);
                  pQVar7 = this;
                } while ((long)pQVar6 < (long)this);
              }
              else {
LAB_0042ca47:
                pQVar7 = pQVar6;
                if ((long)pQVar6 < (long)this) {
                  do {
                    pQVar7 = pQVar6;
                    if ((SettingsImpl::charTraits
                         [*(byte *)((long)&(pQVar6->super_QSettingsPrivate).super_QObjectPrivate.
                                           super_QObjectData._vptr_QObjectData + lVar9)] & 1) == 0)
                    break;
                    pQVar6 = (QConfFileSettingsPrivate *)
                             ((long)&(pQVar6->super_QSettingsPrivate).super_QObjectPrivate.
                                     super_QObjectData._vptr_QObjectData + 1);
                    pQVar7 = this;
                  } while (this != pQVar6);
                }
              }
            }
            pQVar6 = pQVar7;
            *dataPos = (qsizetype)pQVar6;
          }
          else if (bVar1 == 0x22) {
            bVar4 = (bool)(bVar4 ^ 1);
          }
          else if (bVar1 == 0x5c) {
            if (((long)pQVar6 < (long)this) &&
               (pQVar6 = (QConfFileSettingsPrivate *)
                         ((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.
                                 super_QObjectData._vptr_QObjectData + 2), (long)pQVar6 < (long)this
               )) {
              cVar3 = *(char *)((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.
                                       super_QObjectData._vptr_QObjectData + lVar9 + 1);
              cVar2 = *(char *)((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.
                                       super_QObjectData._vptr_QObjectData + lVar9 + 2);
              if ((cVar2 == '\r' && cVar3 == '\n') || (cVar2 == '\n' && cVar3 == '\r')) {
                pQVar6 = (QConfFileSettingsPrivate *)
                         ((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.
                                 super_QObjectData._vptr_QObjectData + 3);
              }
            }
          }
          else {
            if (bVar1 != 0x3d) goto LAB_0042ca11;
            if ((!bVar4) && (*lineLen == -1)) {
              *lineLen = (qsizetype)pQVar5;
            }
          }
LAB_0042ca39:
          pQVar7 = pQVar6;
          pQVar5 = pQVar6;
          if ((long)this <= (long)pQVar6) goto LAB_0042ca72;
        }
        pQVar5 = (QConfFileSettingsPrivate *)
                 ((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData.
                         _vptr_QObjectData + 1);
        pQVar7 = this;
      } while (this != pQVar5);
    }
  }
LAB_0042ca72:
  *(QConfFileSettingsPrivate **)data.m_data = pQVar7;
  lVar9 = *dataPos;
  lVar8 = (long)pQVar7 - lVar9;
  *lineStart = lVar8;
  return lVar8 != 0 && lVar9 <= (long)pQVar7;
}

Assistant:

bool QConfFileSettingsPrivate::readIniLine(QByteArrayView data, qsizetype &dataPos,
                                           qsizetype &lineStart, qsizetype &lineLen,
                                           qsizetype &equalsPos)
{
    constexpr auto Space = SettingsImpl::Space;
    constexpr auto Special = SettingsImpl::Special;
    qsizetype dataLen = data.size();
    bool inQuotes = false;

    equalsPos = -1;

    lineStart = dataPos;
    while (lineStart < dataLen && (charTraits[uint(uchar(data.at(lineStart)))] & Space))
        ++lineStart;

    qsizetype i = lineStart;
    while (i < dataLen) {
        char ch = data.at(i);
        while (!(charTraits[uchar(ch)] & Special)) {
            if (++i == dataLen)
                goto break_out_of_outer_loop;
            ch = data.at(i);
        }

        ++i;
        if (ch == '=') {
            if (!inQuotes && equalsPos == -1)
                equalsPos = i - 1;
        } else if (ch == '\n' || ch == '\r') {
            if (i == lineStart + 1) {
                ++lineStart;
            } else if (!inQuotes) {
                --i;
                goto break_out_of_outer_loop;
            }
        } else if (ch == '\\') {
            if (i < dataLen) {
                char ch = data.at(i++);
                if (i < dataLen) {
                    char ch2 = data.at(i);
                    // \n, \r, \r\n, and \n\r are legitimate line terminators in INI files
                    if ((ch == '\n' && ch2 == '\r') || (ch == '\r' && ch2 == '\n'))
                        ++i;
                }
            }
        } else if (ch == '"') {
            inQuotes = !inQuotes;
        } else {
            Q_ASSERT(ch == ';');

            if (i == lineStart + 1) {
                while (i < dataLen && (((ch = data.at(i)) != '\n') && ch != '\r'))
                    ++i;
                while (i < dataLen && charTraits[uchar(data.at(i))] & Space)
                    ++i;
                lineStart = i;
            } else if (!inQuotes) {
                --i;
                goto break_out_of_outer_loop;
            }
        }
    }

break_out_of_outer_loop:
    dataPos = i;
    lineLen = i - lineStart;
    return lineLen > 0;
}